

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcGeometricRepresentationContext::~IfcGeometricRepresentationContext
          (IfcGeometricRepresentationContext *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  
  p_Var2 = (this->super_IfcRepresentationContext).
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.
           _vptr_ObjectHelper[-3];
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcRepresentationContext).
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.
                   _vptr_ObjectHelper + (long)p_Var2);
  *(undefined8 *)
   ((long)&(this->super_IfcRepresentationContext).
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.
           _vptr_ObjectHelper + (long)p_Var2) = 0x9703f8;
  *(undefined8 *)(&this->field_0xa8 + (long)p_Var2) = 0x970448;
  *(undefined8 *)(&(this->super_IfcRepresentationContext).field_0x60 + (long)p_Var2) = 0x970420;
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       (p_Var2 + (long)&(this->WorldCoordinateSystem).
                        super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                (p_Var2 + (long)&(this->WorldCoordinateSystem).
                                 super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi));
  }
  *(undefined8 *)p_Var1 = 0x970470;
  *(undefined8 *)(p_Var1 + 0xa8) = 0x970498;
  if (*(code **)(p_Var1 + 0x38) != p_Var1 + 0x48) {
    operator_delete(*(code **)(p_Var1 + 0x38),*(long *)(p_Var1 + 0x48) + 1);
  }
  if (*(code **)(p_Var1 + 0x10) != p_Var1 + 0x20) {
    operator_delete(*(code **)(p_Var1 + 0x10),*(long *)(p_Var1 + 0x20) + 1);
  }
  operator_delete(p_Var1,0xc0);
  return;
}

Assistant:

IfcGeometricRepresentationContext() : Object("IfcGeometricRepresentationContext") {}